

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ZipArchiveIOSystem.cpp
# Opt level: O2

bool __thiscall Assimp::ZipArchiveIOSystem::Implement::Exists(Implement *this,string *filename)

{
  iterator iVar1;
  
  MapArchive(this);
  iVar1 = std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Assimp::ZipFileInfo>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Assimp::ZipFileInfo>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Assimp::ZipFileInfo>_>_>
          ::find(&(this->m_ArchiveMap)._M_t,filename);
  return (_Rb_tree_header *)iVar1._M_node !=
         &(this->m_ArchiveMap)._M_t._M_impl.super__Rb_tree_header;
}

Assistant:

bool ZipArchiveIOSystem::Implement::Exists(std::string& filename) {
        MapArchive();

        ZipFileInfoMap::const_iterator it = m_ArchiveMap.find(filename);
        return (it != m_ArchiveMap.end());
    }